

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wmb.cpp
# Opt level: O3

void __thiscall merlin::wmb::run(wmb *this)

{
  run((wmb *)&this[-1].m_types.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  return;
}

Assistant:

void wmb::run() {

	// Start the timer and store it
	m_start_time = timeSystem();

	init();
	tighten(m_num_iter);

	// Output solution (UAI output format)
	std::cout << "[WMB] Converged after " << m_num_iter << " iterations in "
			<< (timeSystem() - m_start_time) << " seconds" << std::endl;

	switch (m_task) {
	case Task::PR:
	case Task::MAR:
		{
			std::cout << "PR" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz)	<< ")" << std::endl;

			if (isinf(m_logz)) {
				std::cout << "STATUS" << std::endl;
				std::cout << "false: Inconsistent evidence or underflow" << std::endl;
			} else {
				std::cout << "STATUS" << std::endl;
				std::cout << "true: Consistent evidence" << std::endl;
			}

			std::cout << "MAR" << std::endl;
			std::cout << m_gmo.nvar();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				variable VX = m_gmo.var(v);
				std::cout << " " << VX.states();
				for (size_t j = 0; j < VX.states(); ++j) {
					std::cout << " " << std::fixed
							<< std::setprecision(MERLIN_PRECISION)
							<< belief(VX)[j];
				}
			}
			std::cout << std::endl;

			break;
		}
	case Task::MAP:
		{
			m_lb = m_gmo.logP(m_best_config);
			std::cout << "Final Upper Bound is " << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific << std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;
			std::cout << "Final Lower Bound is " << std::setprecision(MERLIN_PRECISION)
				<< m_lb << " (" << std::scientific << std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_lb) << ")" << std::endl;
			std::cout << "MAP" << std::endl;
			std::cout << m_gmo.nvar();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				std::cout << " " << m_best_config[v];
			}
			std::cout << std::endl;

			break;
		}
	case Task::MMAP:
		{
			std::cout << "Final Upper Bound is " << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific << std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;
			std::cout << "MMAP" << std::endl;
			std::cout << m_query.size();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				if (m_var_types[v] == true)
					std::cout << " " << m_best_config[v];
			}
			std::cout << std::endl;
			break;
		}
	} // end switch

}